

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_decode_chunks
               (void **idat_out,size_t *idatsize_out,uint *w,uint *h,LodePNGState *state,uchar *in,
               size_t insize)

{
  byte *data;
  LodePNGColorMode *info;
  LodePNGInfo *info_00;
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  int iVar6;
  uchar uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  void *__ptr;
  ulong uVar11;
  uchar *buffer;
  ulong uVar12;
  ulong chunkLength;
  ulong local_80;
  
  *idat_out = (void *)0x0;
  *h = 0;
  *w = 0;
  uVar8 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar8;
  if (uVar8 == 0) {
    uVar8 = *w;
    uVar1 = *h;
    if (CONCAT44(0,uVar1) * (ulong)uVar8 >> 0x3d == 0) {
      info = &(state->info_png).color;
      uVar9 = lodepng_get_bpp(info);
      uVar10 = lodepng_get_bpp(&state->info_raw);
      if (uVar10 < uVar9) {
        uVar10 = uVar9;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)(uVar8 >> 3) * (ulong)uVar10 +
                     ((ulong)(uVar8 & 7) * (ulong)uVar10 + 7 >> 3) + 5;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = CONCAT44(0,uVar1);
      if (SUB168(auVar2 * auVar3,8) == 0) {
        __ptr = malloc(insize);
        if (__ptr == (void *)0x0) {
          state->error = 0x53;
          return 0x53;
        }
        info_00 = &state->info_png;
        buffer = in + 0x21;
        iVar6 = 1;
        local_80 = 0;
        bVar4 = false;
LAB_001b91ff:
        uVar12 = ((long)buffer - (long)in) + 0xc;
        data = buffer + 8;
LAB_001b922b:
        if (bVar4) {
          return 0;
        }
        if (uVar12 <= insize && in <= buffer) {
          uVar8 = lodepng_read32bitInt(buffer);
          if ((int)uVar8 < 0) {
            if ((state->decoder).ignore_end != 0) {
              return 0;
            }
            uVar8 = 0x3f;
            goto LAB_001b97a5;
          }
          chunkLength = (ulong)uVar8;
          uVar11 = uVar12 + chunkLength;
          if ((insize < uVar11) || (uVar11 < (ulong)((long)buffer - (long)in))) {
            uVar8 = 0x40;
            goto LAB_001b97a5;
          }
          uVar7 = lodepng_chunk_type_equals(buffer,"IDAT");
          if (uVar7 == '\0') {
            uVar7 = lodepng_chunk_type_equals(buffer,"IEND");
            if (uVar7 != '\0') {
              bVar4 = true;
              bVar5 = false;
              goto LAB_001b93be;
            }
            uVar7 = lodepng_chunk_type_equals(buffer,"PLTE");
            if (uVar7 != '\0') {
              uVar8 = readChunk_PLTE(info,data,chunkLength);
              state->error = uVar8;
              if (uVar8 != 0) goto LAB_001b97ae;
              bVar5 = true;
              bVar4 = false;
              iVar6 = 2;
              goto LAB_001b93be;
            }
            uVar7 = lodepng_chunk_type_equals(buffer,"tRNS");
            if (uVar7 == '\0') {
              uVar7 = lodepng_chunk_type_equals(buffer,"bKGD");
              if (uVar7 != '\0') {
                uVar8 = readChunk_bKGD(info_00,data,chunkLength);
                goto LAB_001b93a4;
              }
              uVar7 = lodepng_chunk_type_equals(buffer,"tEXt");
              if (uVar7 != '\0') {
                if ((state->decoder).read_text_chunks == 0) goto LAB_001b93bc;
                uVar8 = readChunk_tEXt(info_00,data,chunkLength);
LAB_001b9493:
                state->error = uVar8;
                goto joined_r0x001b949b;
              }
              uVar7 = lodepng_chunk_type_equals(buffer,"zTXt");
              if (uVar7 == '\0') {
                uVar7 = lodepng_chunk_type_equals(buffer,"iTXt");
                if (uVar7 == '\0') {
                  uVar7 = lodepng_chunk_type_equals(buffer,"tIME");
                  if (uVar7 != '\0') {
                    uVar8 = readChunk_tIME(info_00,data,chunkLength);
                    goto LAB_001b93a4;
                  }
                  uVar7 = lodepng_chunk_type_equals(buffer,"pHYs");
                  if (uVar7 == '\0') {
                    uVar7 = lodepng_chunk_type_equals(buffer,"gAMA");
                    if (uVar7 != '\0') {
                      uVar8 = readChunk_gAMA(info_00,data,chunkLength);
                      goto LAB_001b9543;
                    }
                    uVar7 = lodepng_chunk_type_equals(buffer,"cHRM");
                    if (uVar7 != '\0') {
                      uVar8 = readChunk_cHRM(info_00,data,chunkLength);
                      goto LAB_001b9543;
                    }
                    uVar7 = lodepng_chunk_type_equals(buffer,"sRGB");
                    if (uVar7 != '\0') {
                      if (uVar8 == 1) {
                        (state->info_png).srgb_defined = 1;
                        (state->info_png).srgb_intent = (uint)*data;
                        state->error = 0;
                        goto LAB_001b92e7;
                      }
                      uVar8 = 0x62;
                      goto LAB_001b97a5;
                    }
                    uVar7 = lodepng_chunk_type_equals(buffer,"iCCP");
                    if (uVar7 != '\0') {
                      uVar8 = readChunk_iCCP(info_00,&state->decoder,data,chunkLength);
                      state->error = uVar8;
                      goto joined_r0x001b95db;
                    }
                    uVar7 = lodepng_chunk_type_equals(buffer,"cICP");
                    if (uVar7 == '\0') {
                      uVar7 = lodepng_chunk_type_equals(buffer,"mDCv");
                      if (uVar7 == '\0') {
                        uVar7 = lodepng_chunk_type_equals(buffer,"cLLi");
                        if (uVar7 == '\0') {
                          uVar7 = lodepng_chunk_type_equals(buffer,"eXIf");
                          if (uVar7 == '\0') {
                            uVar7 = lodepng_chunk_type_equals(buffer,"sBIT");
                            if (uVar7 != '\0') {
                              uVar8 = readChunk_sBIT(info_00,data,chunkLength);
                              goto LAB_001b9543;
                            }
                            uVar7 = lodepng_chunk_type_name_valid(buffer);
                            if (uVar7 == '\0') {
                              uVar8 = 0x79;
                            }
                            else {
                              if ((buffer[6] & 0x20) == 0) {
                                if (((state->decoder).ignore_critical == 0) &&
                                   ((buffer[4] & 0x20) == 0)) {
                                  uVar8 = 0x45;
                                  goto LAB_001b97a5;
                                }
                                if ((state->decoder).remember_unknown_chunks != 0) {
                                  uVar8 = lodepng_chunk_append
                                                    ((state->info_png).unknown_chunks_data +
                                                     (iVar6 - 1U),
                                                     (state->info_png).unknown_chunks_size +
                                                     (iVar6 - 1U),buffer);
                                  state->error = uVar8;
                                  if (uVar8 != 0) goto LAB_001b97ae;
                                }
                                bVar4 = false;
                                goto LAB_001b972f;
                              }
                              uVar8 = 0x7a;
                            }
                            goto LAB_001b97a5;
                          }
                          uVar8 = lodepng_set_exif(info_00,data,uVar8);
                        }
                        else {
                          uVar8 = readChunk_cLLi(info_00,data,chunkLength);
                        }
                      }
                      else {
                        uVar8 = readChunk_mDCv(info_00,data,chunkLength);
                      }
                    }
                    else {
                      uVar8 = readChunk_cICP(info_00,data,chunkLength);
                    }
                  }
                  else {
                    uVar8 = readChunk_pHYs(info_00,data,chunkLength);
                  }
LAB_001b9543:
                  state->error = uVar8;
joined_r0x001b95db:
                  if (uVar8 != 0) goto LAB_001b97ae;
                  goto LAB_001b92e7;
                }
                if ((state->decoder).read_text_chunks != 0) {
                  uVar8 = readChunk_iTXt(info_00,&state->decoder,data,chunkLength);
                  goto LAB_001b9493;
                }
              }
              else if ((state->decoder).read_text_chunks != 0) {
                uVar8 = readChunk_zTXt(info_00,&state->decoder,data,chunkLength);
                goto LAB_001b9493;
              }
            }
            else {
              uVar8 = readChunk_tRNS(info,data,chunkLength);
LAB_001b93a4:
              state->error = uVar8;
joined_r0x001b949b:
              if (uVar8 != 0) goto LAB_001b97ae;
            }
LAB_001b93bc:
            bVar5 = true;
            bVar4 = false;
          }
          else {
            uVar11 = local_80 + chunkLength;
            if ((CARRY8(local_80,chunkLength)) || (insize < uVar11)) {
              uVar8 = 0x5f;
              goto LAB_001b97a5;
            }
            lodepng_memcpy((void *)(local_80 + (long)__ptr),data,chunkLength);
            *idat_out = __ptr;
            *idatsize_out = uVar11;
            iVar6 = 3;
            local_80 = uVar11;
LAB_001b92e7:
            bVar4 = false;
            bVar5 = true;
          }
LAB_001b93be:
          if (((state->decoder).ignore_crc == 0) &&
             (uVar8 = lodepng_chunk_check_crc(buffer), uVar8 != 0)) {
            uVar8 = 0x39;
            goto LAB_001b97a5;
          }
          if (bVar5) goto LAB_001b972f;
          goto LAB_001b922b;
        }
        if ((state->decoder).ignore_end != 0) {
          return 0;
        }
        uVar8 = 0x1e;
LAB_001b97a5:
        state->error = uVar8;
LAB_001b97ae:
        free(__ptr);
        return uVar8;
      }
    }
    state->error = 0x5c;
    uVar8 = 0x5c;
  }
  return uVar8;
LAB_001b972f:
  buffer = lodepng_chunk_next_const(buffer,in + insize);
  goto LAB_001b91ff;
}

Assistant:

unsigned lodepng_decode_chunks(void** idat_out, size_t* idatsize_out, unsigned* w, unsigned* h,
                               LodePNGState* state,
                               const unsigned char* in, size_t insize) {
  unsigned char IEND = 0;
  unsigned char* idat;
  size_t idatsize = 0;
  const unsigned char* chunk; /*points to beginning of next chunk*/

  /*for unknown chunk order*/
  unsigned unknown = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  unsigned critical_pos = 1; /*1 = after IHDR, 2 = after PLTE, 3 = after IDAT*/
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/


  /* safe output values in case error happens */
  *idat_out = 0;
  *w = *h = 0;

  state->error = lodepng_inspect(w, h, state, in, insize); /*reads header and resets other parameters in state->info_png*/
  if(state->error) return state->error;

  if(lodepng_pixel_overflow(*w, *h, &state->info_png.color, &state->info_raw)) {
      CERROR_RETURN_ERROR(state->error, 92); /*overflow possible due to amount of pixels*/
  }

  /*the input filesize is a safe upper bound for the sum of idat chunks size*/
  idat = (unsigned char*)lodepng_malloc(insize);
  if(!idat) CERROR_RETURN_ERROR(state->error, 83); /*alloc fail*/

  chunk = &in[33]; /*first byte of the first chunk after the header*/

  /*loop through the chunks, ignoring unknown chunks and stopping at IEND chunk.
  IDAT data is put at the start of the in buffer*/
  while(!IEND && !state->error) {
    unsigned chunkLength;
    const unsigned char* data; /*the data in the chunk*/
    size_t pos = (size_t)(chunk - in);

    /*error: next chunk out of bounds of the in buffer*/
    if(chunk < in || pos + 12 > insize) {
      if(state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 30);
    }

    /*length of the data of the chunk, excluding the 12 bytes for length, chunk type and CRC*/
    chunkLength = lodepng_chunk_length(chunk);
    /*error: chunk length larger than the max PNG chunk size*/
    if(chunkLength > 2147483647) {
      if(state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 63);
    }

    if(pos + (size_t)chunkLength + 12 > insize || pos + (size_t)chunkLength + 12 < pos) {
      CERROR_BREAK(state->error, 64); /*error: size of the in buffer too small to contain next chunk (or int overflow)*/
    }

    data = lodepng_chunk_data_const(chunk);

    unknown = 0;

    /*IDAT chunk, containing compressed image data*/
    if(lodepng_chunk_type_equals(chunk, "IDAT")) {
      size_t newsize;
      if(lodepng_addofl(idatsize, chunkLength, &newsize)) CERROR_BREAK(state->error, 95);
      if(newsize > insize) CERROR_BREAK(state->error, 95);
      lodepng_memcpy(idat + idatsize, data, chunkLength);
      idatsize += chunkLength;
      *idat_out = idat;
      *idatsize_out = idatsize;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 3;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else if(lodepng_chunk_type_equals(chunk, "IEND")) {
      /*IEND chunk*/
      IEND = 1;
    } else if(lodepng_chunk_type_equals(chunk, "PLTE")) {
      /*palette chunk (PLTE)*/
      state->error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 2;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
      /*palette transparency chunk (tRNS). Even though this one is an ancillary chunk , it is still compiled
      in without 'LODEPNG_COMPILE_ANCILLARY_CHUNKS' because it contains essential color information that
      affects the alpha channel of pixels. */
      state->error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      /*background color chunk (bKGD)*/
    } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
      state->error = readChunk_bKGD(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
      /*text chunk (tEXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_tEXt(&state->info_png, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
      /*compressed text chunk (zTXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_zTXt(&state->info_png, &state->decoder, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
      /*international text chunk (iTXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_iTXt(&state->info_png, &state->decoder, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
      state->error = readChunk_tIME(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
      state->error = readChunk_pHYs(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
      state->error = readChunk_gAMA(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
      state->error = readChunk_cHRM(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
      state->error = readChunk_sRGB(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
      state->error = readChunk_iCCP(&state->info_png, &state->decoder, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cICP")) {
      state->error = readChunk_cICP(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "mDCv")) {
      state->error = readChunk_mDCv(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cLLi")) {
      state->error = readChunk_cLLi(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "eXIf")) {
      state->error = readChunk_eXIf(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "sBIT")) {
      state->error = readChunk_sBIT(&state->info_png, data, chunkLength);
      if(state->error) break;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else /*it's not an implemented chunk type, so ignore it: skip over the data*/ {
      if(!lodepng_chunk_type_name_valid(chunk)) {
        CERROR_BREAK(state->error, 121); /* invalid chunk type name */
      }
      if(lodepng_chunk_reserved(chunk)) {
        CERROR_BREAK(state->error, 122); /* invalid third lowercase character */
      }

      /*error: unknown critical chunk (5th bit of first byte of chunk type is 0)*/
      if(!state->decoder.ignore_critical && !lodepng_chunk_ancillary(chunk)) {
        CERROR_BREAK(state->error, 69);
      }

      unknown = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      if(state->decoder.remember_unknown_chunks) {
        state->error = lodepng_chunk_append(&state->info_png.unknown_chunks_data[critical_pos - 1],
                                            &state->info_png.unknown_chunks_size[critical_pos - 1], chunk);
        if(state->error) break;
      }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }

    if(!state->decoder.ignore_crc && !unknown) /*check CRC if wanted, only on known chunk types*/ {
      if(lodepng_chunk_check_crc(chunk)) CERROR_BREAK(state->error, 57); /*invalid CRC*/
    }

    if(!IEND) chunk = lodepng_chunk_next_const(chunk, in + insize);
  }

  if (state->error) lodepng_free(idat);
  return state->error;
}